

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDeprecated.cpp
# Opt level: O1

HighsStatus __thiscall
Highs::setLogCallback
          (Highs *this,_func_void_HighsLogType_char_ptr_void_ptr *user_log_callback,
          void *user_log_callback_data)

{
  string local_68;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"setLogCallback","");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"setCallback","");
  deprecationMessage(this,&local_48,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  (this->options_).super_HighsOptionsStruct.log_options.user_log_callback = user_log_callback;
  (this->options_).super_HighsOptionsStruct.log_options.user_log_callback_data =
       user_log_callback_data;
  return kOk;
}

Assistant:

HighsStatus Highs::setLogCallback(void (*user_log_callback)(HighsLogType,
                                                            const char*, void*),
                                  void* user_log_callback_data) {
  deprecationMessage("setLogCallback", "setCallback");
  options_.log_options.user_log_callback = user_log_callback;
  options_.log_options.user_log_callback_data = user_log_callback_data;
  return HighsStatus::kOk;
}